

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

void Wln_ObjPrint(Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int Type;
  int iFanin;
  int k;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  iVar1 = Wln_ObjType(p,iObj);
  pcVar3 = Abc_OperName(iVar1);
  uVar2 = Wln_ObjFaninNum(p,iObj);
  printf("Obj %6d : Type = %6s  Fanins = %d : ",(ulong)(uint)iObj,pcVar3,(ulong)uVar2);
  for (Type = 0; iVar1 = Wln_ObjFaninNum(p,iObj), Type < iVar1; Type = Type + 1) {
    uVar2 = Wln_ObjFanin(p,iObj,Type);
    if (uVar2 != 0) {
      printf("%5d ",(ulong)uVar2);
    }
  }
  printf("\n");
  return;
}

Assistant:

void Wln_ObjPrint( Wln_Ntk_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p, iObj);
    printf( "Obj %6d : Type = %6s  Fanins = %d : ", iObj, Abc_OperName(Type), Wln_ObjFaninNum(p, iObj) );
    Wln_ObjForEachFanin( p, iObj, iFanin, k )
        printf( "%5d ", iFanin );
    printf( "\n" );
}